

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSimpleUpdater.cpp
# Opt level: O0

void __thiscall QSimpleUpdater::~QSimpleUpdater(QSimpleUpdater *this)

{
  bool bVar1;
  QList<Updater_*> *t;
  Updater *updater;
  undefined1 local_40 [8];
  QForeachContainer<QList<Updater_*>_> _container_34;
  QSimpleUpdater *this_local;
  
  *(undefined ***)this = &PTR_metaObject_0012b2b0;
  _container_34._40_8_ = this;
  QList<QString>::clear(&URLS);
  QtPrivate::qMakeForeachContainer<QList<Updater*>&>
            ((QForeachContainer<QList<Updater_*>_> *)local_40,(QtPrivate *)&UPDATERS,t);
  while( true ) {
    bVar1 = QList<Updater_*>::const_iterator::operator!=
                      ((const_iterator *)&_container_34.c.d.size,_container_34.i);
    if (!bVar1) break;
    QList<Updater_*>::const_iterator::operator*((const_iterator *)&_container_34.c.d.size);
    QObject::deleteLater();
    QList<Updater_*>::const_iterator::operator++((const_iterator *)&_container_34.c.d.size);
  }
  QtPrivate::QForeachContainer<QList<Updater_*>_>::~QForeachContainer
            ((QForeachContainer<QList<Updater_*>_> *)local_40);
  QList<Updater_*>::clear(&UPDATERS);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSimpleUpdater::~QSimpleUpdater()
{
   URLS.clear();

   foreach (Updater *updater, UPDATERS)
      updater->deleteLater();

   UPDATERS.clear();
}